

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::entry_point_arg_stage_in_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this)

{
  bool bVar1;
  SPIRVariable *var;
  SPIRType *pSVar2;
  char (*in_R9) [14];
  string local_80 [32];
  spirv_cross local_60 [32];
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = is_tesc_shader(this);
  if ((!bVar1) || ((this->msl_options).multi_patch_workgroup == false)) {
    bVar1 = is_tese_shader(this);
    if ((!bVar1) || ((this->msl_options).raw_buffer_tese_input == false)) {
      bVar1 = is_tese_shader(this);
      if (this->next_metal_resource_ids[(ulong)bVar1 * 2 + 8] != 0) {
        var = Compiler::get<spirv_cross::SPIRVariable>
                        ((Compiler *)this,this->next_metal_resource_ids[(ulong)bVar1 * 2 + 8]);
        pSVar2 = Compiler::get_variable_data_type((Compiler *)this,var);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(var->super_IVariant).self.id);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_60,this,pSVar2,0);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (local_80,this,(ulong)(var->super_IVariant).self.id,1);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[14]>
                  (&local_40,local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27f106,
                   (char (*) [2])local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   " [[stage_in]]",in_R9);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
        ::std::__cxx11::string::~string((string *)&local_40);
        ::std::__cxx11::string::~string(local_80);
        ::std::__cxx11::string::~string((string *)local_60);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::entry_point_arg_stage_in()
{
	string decl;

	if ((is_tesc_shader() && msl_options.multi_patch_workgroup) ||
	    (is_tese_shader() && msl_options.raw_buffer_tese_input))
		return decl;

	// Stage-in structure
	uint32_t stage_in_id;
	if (is_tese_shader())
		stage_in_id = patch_stage_in_var_id;
	else
		stage_in_id = stage_in_var_id;

	if (stage_in_id)
	{
		auto &var = get<SPIRVariable>(stage_in_id);
		auto &type = get_variable_data_type(var);

		add_resource_name(var.self);
		decl = join(type_to_glsl(type), " ", to_name(var.self), " [[stage_in]]");
	}

	return decl;
}